

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

Entry * __thiscall
wasm::TypeBuilder::Entry::copy<TypeTest_CanonicalizeExactRefs_Test::TestBody()::__0>
          (Entry *this,HeapType type,anon_class_8_1_911e227b map)

{
  anon_class_16_2_633b9489 *paVar1;
  Type TVar2;
  uintptr_t *puVar3;
  uintptr_t uVar4;
  undefined4 uVar5;
  long lVar6;
  undefined8 uVar7;
  Type TVar8;
  long *plVar9;
  long lVar10;
  long lVar11;
  uintptr_t *puVar12;
  undefined1 auVar13 [16];
  Signature SVar14;
  Array AVar15;
  undefined1 local_a0 [8];
  anon_class_16_2_633b9489 copySingleType;
  undefined1 local_88 [8];
  anon_class_16_2_ecc023e0 copyType;
  Field field;
  undefined1 auStack_58 [8];
  vector<wasm::Field,_std::allocator<wasm::Field>_> fields;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> local_38;
  
  paVar1 = (anon_class_16_2_633b9489 *)this->builder;
  TVar2.id = this->index;
  fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)type.id;
  local_38._M_head_impl = (Impl *)map.builder;
  if (type.id < 0x7d) {
    __assert_fail("!type.isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x2df,
                  "void wasm::TypeBuilder::copyHeapType(size_t, HeapType, F) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)]"
                 );
  }
  auVar13 = ::wasm::HeapType::getDeclaredSuperType();
  if ((auVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_001df58b:
    auVar13 = ::wasm::HeapType::getDescriptorType();
    if ((auVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_001df5df:
      auVar13 = ::wasm::HeapType::getDescribedType();
      if ((auVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_001df633:
        ::wasm::HeapType::isOpen();
        ::wasm::TypeBuilder::setOpen((ulong)paVar1,SUB81(TVar2.id,0));
        ::wasm::HeapType::getShared();
        ::wasm::TypeBuilder::setShared((ulong)paVar1,(Shareability)TVar2.id);
        local_88 = (undefined1  [8])local_a0;
        copySingleType.this = (TypeBuilder *)&local_38;
        local_a0 = (undefined1  [8])paVar1;
        copyType.copySingleType = paVar1;
        uVar5 = ::wasm::HeapType::getKind();
        switch(uVar5) {
        case 0:
          ::wasm::handle_unreachable
                    ("unexpected kind",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                     ,0x31b);
        case 1:
          auVar13 = ::wasm::HeapType::getSignature();
          TVar8 = copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
                  ::anon_class_16_2_ecc023e0::operator()
                            ((anon_class_16_2_ecc023e0 *)local_88,auVar13._0_8_);
          copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
          ::anon_class_16_2_ecc023e0::operator()
                    ((anon_class_16_2_ecc023e0 *)local_88,(Type)auVar13._8_8_);
          SVar14.results.id = TVar8.id;
          SVar14.params.id = TVar2.id;
          ::wasm::TypeBuilder::setHeapType((ulong)paVar1,SVar14);
          break;
        case 2:
          copySingleType.map = (anon_class_8_1_911e227b *)this;
          plVar9 = (long *)::wasm::HeapType::getStruct();
          auStack_58 = (undefined1  [8])0x0;
          fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::reserve
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_58,
                     plVar9[1] - *plVar9 >> 4);
          puVar12 = (uintptr_t *)*plVar9;
          puVar3 = (uintptr_t *)plVar9[1];
          if (puVar12 != puVar3) {
            do {
              copyType.this = (TypeBuilder *)*puVar12;
              uVar4 = puVar12[1];
              copyType.this =
                   (TypeBuilder *)
                   copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
                   ::anon_class_16_2_ecc023e0::operator()
                             ((anon_class_16_2_ecc023e0 *)local_88,(Type)copyType.this);
              if (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<wasm::Field,std::allocator<wasm::Field>>::
                _M_realloc_insert<wasm::Field_const&>
                          ((vector<wasm::Field,std::allocator<wasm::Field>> *)auStack_58,
                           (iterator)
                           fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                           _M_impl.super__Vector_impl_data._M_start,(Field *)&copyType.this);
              }
              else {
                ((fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_start)->type).id = (uintptr_t)copyType.this;
                (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_start)->packedType = (int)uVar4;
                (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_start)->mutable_ = (int)(uVar4 >> 0x20);
                fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                super__Vector_impl_data._M_start =
                     fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
              puVar12 = puVar12 + 2;
            } while (puVar12 != puVar3);
          }
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&copyType.this,
                     (vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_58);
          ::wasm::TypeBuilder::setHeapType((ulong)paVar1,(Struct *)TVar2.id);
          this = (Entry *)copySingleType.map;
          if (copyType.this != (TypeBuilder *)0x0) {
            operator_delete(copyType.this,field._8_8_ - (long)copyType.this);
          }
          if (auStack_58 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_58,
                            (long)fields.
                                  super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
          }
          break;
        case 3:
          ::wasm::HeapType::getArray();
          auStack_58 = (undefined1  [8])
                       copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp:445:20)>
                       ::anon_class_16_2_ecc023e0::operator()
                                 ((anon_class_16_2_ecc023e0 *)local_88,(Type)auStack_58);
          AVar15.element._8_8_ = auStack_58;
          AVar15.element.type.id = TVar2.id;
          ::wasm::TypeBuilder::setHeapType((ulong)paVar1,AVar15);
          break;
        case 4:
          lVar11 = ::wasm::HeapType::getContinuation();
          lVar6 = 0;
          do {
            lVar10 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
            if (lVar10 == lVar11) {
              ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
              ::wasm::TypeBuilder::setHeapType((ulong)paVar1,(Continuation)TVar2.id);
              return this;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != 4);
          goto LAB_001df7ec;
        }
        return this;
      }
      lVar11 = 0;
      do {
        lVar6 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
        if (lVar6 == auVar13._0_8_) {
          uVar7 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
          ::wasm::TypeBuilder::setDescribed(paVar1,TVar2.id,uVar7,1);
          goto LAB_001df633;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
    }
    else {
      lVar11 = 0;
      do {
        lVar6 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
        if (lVar6 == auVar13._0_8_) {
          uVar7 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
          ::wasm::TypeBuilder::setDescriptor(paVar1,TVar2.id,uVar7,1);
          goto LAB_001df5df;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
    }
  }
  else {
    lVar11 = 0;
    do {
      lVar6 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
      if (lVar6 == auVar13._0_8_) {
        uVar7 = ::wasm::TypeBuilder::getTempHeapType((ulong)local_38._M_head_impl);
        ::wasm::TypeBuilder::setSubType(paVar1,TVar2.id,uVar7,1);
        goto LAB_001df58b;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
  }
LAB_001df7ec:
  ::wasm::handle_unreachable
            ("unexpected type",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
             ,0x1c3);
}

Assistant:

Entry& copy(HeapType type, F map) {
      builder.copyHeapType(index, type, map);
      return *this;
    }